

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

void __thiscall
QMakeSourceFileInfo::addSourceFile
          (QMakeSourceFileInfo *this,QString *f,uchar seek,SourceFileType type)

{
  SourceFiles *this_00;
  SourceFile *p;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_80;
  QMakeLocalFileName local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->files == (SourceFiles *)0x0) {
    this_00 = (SourceFiles *)operator_new(0x10);
    SourceFiles::SourceFiles(this_00);
    this->files = this_00;
  }
  local_68.local_name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_68.local_name.d.size = -0x5555555555555556;
  local_68.real_name.d.size = -0x5555555555555556;
  local_68.local_name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.real_name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.real_name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QMakeLocalFileName::QMakeLocalFileName(&local_68,f);
  p = SourceFiles::lookupFile(this->files,&local_68);
  if (p == (SourceFile *)0x0) {
    p = (SourceFile *)operator_new(0x40);
    (p->file).real_name.d.d = (Data *)0x0;
    (p->file).real_name.d.ptr = (char16_t *)0x0;
    (p->file).real_name.d.size = 0;
    (p->file).local_name.d.d = (Data *)0x0;
    (p->file).local_name.d.ptr = (char16_t *)0x0;
    (p->file).local_name.d.size = 0;
    *(undefined8 *)((long)&(p->file).local_name.d.size + 4) = 0;
    *(undefined8 *)((long)&p->deps + 4) = 0;
    *(undefined2 *)&p->field_0x3c = 4;
    QMakeLocalFileName::operator=((QMakeLocalFileName *)p,&local_68);
    SourceFiles::addFile(this->files,p,(char *)0x0,true);
LAB_001692be:
    if (type == TYPE_UNKNOWN) goto LAB_001692c7;
  }
  else {
    if (((p->type == type) || (type == TYPE_UNKNOWN)) || (p->type == TYPE_UNKNOWN))
    goto LAB_001692be;
    QString::toLatin1_helper((QString *)&local_80);
    if (local_80.ptr == (char *)0x0) {
      local_80.ptr = (char *)&QByteArray::_empty;
    }
    warn_msg(WarnLogic,"%s is marked as %d, then %d!",local_80.ptr,(ulong)p->type,(ulong)type);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
  }
  p->type = type;
LAB_001692c7:
  if (((seek & 2) != 0) && ((p->field_0x3c & 8) == 0)) {
    findMocs(this,p);
  }
  if (((seek & 1) != 0) && ((p->field_0x3c & 0x10) == 0)) {
    findDeps(this,p);
  }
  QMakeLocalFileName::~QMakeLocalFileName(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeSourceFileInfo::addSourceFile(const QString &f, uchar seek,
                                        QMakeSourceFileInfo::SourceFileType type)
{
    if(!files)
        files = new SourceFiles;

    QMakeLocalFileName fn(f);
    SourceFile *file = files->lookupFile(fn);
    if(!file) {
        file = new SourceFile;
        file->file = fn;
        files->addFile(file);
    } else {
        if(file->type != type && file->type != TYPE_UNKNOWN && type != TYPE_UNKNOWN)
            warn_msg(WarnLogic, "%s is marked as %d, then %d!", f.toLatin1().constData(),
                     file->type, type);
    }
    if(type != TYPE_UNKNOWN)
        file->type = type;

    if(seek & SEEK_MOCS && !file->moc_checked)
        findMocs(file);
    if(seek & SEEK_DEPS && !file->dep_checked)
        findDeps(file);
}